

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<tinyusdz::value::quath> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<tinyusdz::value::quath>
          (optional<tinyusdz::value::quath> *__return_storage_ptr__,PrimVar *this)

{
  optional<tinyusdz::value::quath> local_22;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<tinyusdz::value::quath>(&local_22,this);
  nonstd::optional_lite::optional<tinyusdz::value::quath>::optional<tinyusdz::value::quath,_0>
            (__return_storage_ptr__,&local_22);
  nonstd::optional_lite::optional<tinyusdz::value::quath>::~optional(&local_22);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }